

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

Matrix_Sparse_Row<Disa::Matrix_Sparse> __thiscall
Disa::Matrix_Sparse::operator[](Matrix_Sparse *this,size_t *i_row)

{
  ostream *poVar1;
  source_location *location;
  size_t *in_RDX;
  size_t extraout_RDX;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> MVar2;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  location = (source_location *)*i_row;
  if ((i_row[1] - (long)location != 0) && (*in_RDX < ((long)(i_row[1] - (long)location) >> 3) - 1U))
  {
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::Matrix_Sparse_Row
              ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)this,*in_RDX,(matrix_type *)i_row);
    MVar2.row_index = extraout_RDX;
    MVar2.matrix = this;
    return MVar2;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_0017bde0;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::to_string(&local_e8,*in_RDX);
  std::operator+(&local_c8,"Row ",&local_e8);
  std::operator+(&local_a8,&local_c8," not in range ");
  range_row_abi_cxx11_(&sStack_108,(Matrix_Sparse *)i_row);
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

Matrix_Sparse_Row<Matrix_Sparse> Matrix_Sparse::operator[](const std::size_t& i_row) {
  ASSERT_DEBUG(i_row < size_row(), "Row " + std::to_string(i_row) + " not in range " + range_row() + ".");
  return {i_row, this};
}